

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O2

Program __thiscall Pass3::run(Pass3 *this,Program *program)

{
  Function *pFVar1;
  pointer ppTVar2;
  bool bVar3;
  Function *this_00;
  Type *pTVar4;
  mapped_type *ppFVar5;
  Function *extraout_RDX;
  pointer ppTVar6;
  Program *pPVar7;
  Program PVar8;
  Function *function;
  vector<const_Type_*,_std::allocator<const_Type_*>_> argument_types;
  Type *local_98;
  TypeTable type_table;
  FunctionTable function_table;
  
  type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &type_table._M_t._M_impl.super__Rb_tree_header._M_header;
  type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  type_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &function_table._M_t._M_impl.super__Rb_tree_header._M_header;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)0x0;
  this->type_table = (TypeTable *)0x0;
  pPVar7 = program;
  type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pFVar1 = pPVar7->first, pFVar1 != (Function *)0x0) {
    function = pFVar1;
    bVar3 = is_empty_tuple(pFVar1->return_type);
    if (!bVar3) {
      argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ppTVar2 = (function->argument_types).
                super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppTVar6 = (function->argument_types).
                     super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppTVar6 != ppTVar2; ppTVar6 = ppTVar6 + 1) {
        pTVar4 = *ppTVar6;
        bVar3 = is_empty_tuple(pTVar4);
        if (!bVar3) {
          local_98 = transform_type(&type_table,pTVar4);
          std::vector<Type_const*,std::allocator<Type_const*>>::emplace_back<Type_const*>
                    ((vector<Type_const*,std::allocator<Type_const*>> *)&argument_types,&local_98);
        }
      }
      this_00 = (Function *)operator_new(0x60);
      pTVar4 = transform_type(&type_table,function->return_type);
      Function::Function(this_00,&argument_types,pTVar4);
      Program::add_function((Program *)this,this_00);
      ppFVar5 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[](&function_table,&function);
      *ppFVar5 = this_00;
      std::_Vector_base<const_Type_*,_std::allocator<const_Type_*>_>::~_Vector_base
                ((_Vector_base<const_Type_*,_std::allocator<const_Type_*>_> *)&argument_types);
    }
    pPVar7 = (Program *)&pFVar1->next_function;
  }
  while (pFVar1 = program->first, pFVar1 != (Function *)0x0) {
    argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pFVar1;
    bVar3 = is_empty_tuple(pFVar1->return_type);
    if (!bVar3) {
      ppFVar5 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[](&function_table,(key_type *)&argument_types);
      evaluate(&type_table,&function_table,
               (Function *)
               argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
               _M_impl.super__Vector_impl_data._M_start,&(*ppFVar5)->block,
               (Block *)(argument_types.
                         super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                         super__Vector_impl_data._M_start + 4));
    }
    program = (Program *)&pFVar1->next_function;
  }
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::~_Rb_tree(&function_table._M_t);
  std::
  _Rb_tree<const_Type_*,_std::pair<const_Type_*const,_const_Type_*>,_std::_Select1st<std::pair<const_Type_*const,_const_Type_*>_>,_std::less<const_Type_*>,_std::allocator<std::pair<const_Type_*const,_const_Type_*>_>_>
  ::~_Rb_tree(&type_table._M_t);
  PVar8.last = extraout_RDX;
  PVar8.first = (Function *)this;
  return PVar8;
}

Assistant:

static Program run(const Program& program) {
		Program new_program;
		TypeTable type_table;
		FunctionTable function_table;
		for (const Function* function: program) {
			if (is_empty_tuple(function->get_return_type())) {
				continue;
			}
			std::vector<const Type*> argument_types;
			for (const Type* type: function->get_argument_types()) {
				if (!is_empty_tuple(type)) {
					argument_types.push_back(transform_type(type_table, type));
				}
			}
			Function* new_function = new Function(argument_types, transform_type(type_table, function->get_return_type()));
			new_program.add_function(new_function);
			function_table[function] = new_function;
		}
		for (const Function* function: program) {
			if (is_empty_tuple(function->get_return_type())) {
				continue;
			}
			Function* new_function = function_table[function];
			evaluate(type_table, function_table, function, new_function->get_block(), function->get_block());
		}
		return new_program;
	}